

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx::OrientedDiscMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  undefined4 uVar17;
  RTCRayN *pRVar18;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [64];
  float fVar46;
  undefined1 auVar47 [32];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vbool<4> valid;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a8 [16];
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  ulong uVar19;
  undefined1 auVar44 [64];
  
  pSVar9 = context->scene;
  uVar19 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar10->time_range).lower;
  fVar1 = pGVar10->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar10->time_range).upper - fVar1));
  auVar27 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar27 = vminss_avx(auVar27,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar34 = vmaxss_avx(ZEXT816(0) << 0x20,auVar27);
  iVar20 = (int)auVar34._0_4_;
  lVar22 = *(long *)&pGVar10[2].numPrimitives;
  lVar26 = (long)iVar20 * 0x38;
  lVar11 = *(long *)(lVar22 + lVar26);
  lVar25 = *(long *)(lVar22 + 0x10 + lVar26);
  auVar27 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar19);
  uVar24 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar33 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar24);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar31 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar21);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar8 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar23);
  p_Var12 = pGVar10[2].intersectionFilterN;
  lVar11 = *(long *)(p_Var12 + lVar26);
  lVar25 = *(long *)(p_Var12 + lVar26 + 0x10);
  auVar28 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar19);
  auVar32 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar24);
  auVar29 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar21);
  auVar36 = *(undefined1 (*) [16])(lVar11 + lVar25 * uVar23);
  lVar25 = (long)(iVar20 + 1) * 0x38;
  lVar11 = *(long *)(lVar22 + lVar25);
  lVar22 = *(long *)(lVar22 + 0x10 + lVar25);
  auVar41 = *(undefined1 (*) [16])(lVar11 + lVar22 * uVar19);
  auVar40 = *(undefined1 (*) [16])(lVar11 + lVar22 * uVar24);
  auVar56 = *(undefined1 (*) [16])(lVar11 + lVar22 * uVar21);
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar22 * uVar23);
  lVar22 = *(long *)(p_Var12 + lVar25);
  lVar11 = *(long *)(p_Var12 + lVar25 + 0x10);
  auVar53 = *(undefined1 (*) [16])(lVar22 + uVar19 * lVar11);
  auVar30 = *(undefined1 (*) [16])(lVar22 + uVar24 * lVar11);
  fVar1 = fVar1 - auVar34._0_4_;
  auVar43 = vunpcklps_avx(auVar27,auVar31);
  auVar34 = vunpckhps_avx(auVar27,auVar31);
  auVar27 = vunpcklps_avx(auVar33,auVar8);
  auVar42 = vunpckhps_avx(auVar33,auVar8);
  auVar14 = vunpcklps_avx(auVar43,auVar27);
  auVar33 = vunpckhps_avx(auVar43,auVar27);
  auVar43 = vunpcklps_avx(auVar28,auVar29);
  auVar31 = vunpckhps_avx(auVar28,auVar29);
  auVar28 = vunpcklps_avx(auVar32,auVar36);
  auVar8 = vunpckhps_avx(auVar32,auVar36);
  auVar27 = *(undefined1 (*) [16])(lVar22 + uVar21 * lVar11);
  auVar36 = vunpcklps_avx(auVar31,auVar8);
  auVar15 = vunpcklps_avx(auVar43,auVar28);
  auVar31 = vunpckhps_avx(auVar43,auVar28);
  auVar8 = vunpcklps_avx(auVar41,auVar56);
  auVar29 = vunpckhps_avx(auVar41,auVar56);
  auVar28 = vunpcklps_avx(auVar40,auVar57);
  local_e8 = vunpckhps_avx(auVar40,auVar57);
  auVar41 = vunpcklps_avx(auVar8,auVar28);
  auVar28 = vunpckhps_avx(auVar8,auVar28);
  auVar32 = vunpcklps_avx(auVar53,auVar27);
  auVar8 = vunpckhps_avx(auVar53,auVar27);
  auVar27 = *(undefined1 (*) [16])(lVar22 + lVar11 * uVar23);
  auVar40 = vunpcklps_avx(auVar30,auVar27);
  auVar27 = vunpckhps_avx(auVar30,auVar27);
  auVar56 = vunpcklps_avx(auVar8,auVar27);
  auVar57 = vunpcklps_avx(auVar32,auVar40);
  auVar32 = vunpckhps_avx(auVar32,auVar40);
  auVar8 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar27 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar46 = auVar8._0_4_;
  fVar49 = auVar8._4_4_;
  fVar50 = auVar8._8_4_;
  fVar51 = auVar8._12_4_;
  fVar35 = auVar27._0_4_;
  fVar37 = auVar27._4_4_;
  fVar38 = auVar27._8_4_;
  fVar39 = auVar27._12_4_;
  auVar40._0_4_ = fVar35 * auVar14._0_4_ + fVar46 * auVar41._0_4_;
  auVar40._4_4_ = fVar37 * auVar14._4_4_ + fVar49 * auVar41._4_4_;
  auVar40._8_4_ = fVar38 * auVar14._8_4_ + fVar50 * auVar41._8_4_;
  auVar40._12_4_ = fVar39 * auVar14._12_4_ + fVar51 * auVar41._12_4_;
  auVar53._0_4_ = fVar35 * auVar33._0_4_ + fVar46 * auVar28._0_4_;
  auVar53._4_4_ = fVar37 * auVar33._4_4_ + fVar49 * auVar28._4_4_;
  auVar53._8_4_ = fVar38 * auVar33._8_4_ + fVar50 * auVar28._8_4_;
  auVar53._12_4_ = fVar39 * auVar33._12_4_ + fVar51 * auVar28._12_4_;
  local_f8 = fVar35 * auVar15._0_4_ + fVar46 * auVar57._0_4_;
  fStack_f4 = fVar37 * auVar15._4_4_ + fVar49 * auVar57._4_4_;
  fStack_f0 = fVar38 * auVar15._8_4_ + fVar50 * auVar57._8_4_;
  fStack_ec = fVar39 * auVar15._12_4_ + fVar51 * auVar57._12_4_;
  local_208._0_4_ = auVar31._0_4_;
  local_208._4_4_ = auVar31._4_4_;
  fStack_200 = auVar31._8_4_;
  fStack_1fc = auVar31._12_4_;
  local_108 = fVar35 * (float)local_208._0_4_ + fVar46 * auVar32._0_4_;
  fStack_104 = fVar37 * (float)local_208._4_4_ + fVar49 * auVar32._4_4_;
  fStack_100 = fVar38 * fStack_200 + fVar50 * auVar32._8_4_;
  fStack_fc = fVar39 * fStack_1fc + fVar51 * auVar32._12_4_;
  local_1f8._0_4_ = auVar36._0_4_;
  local_1f8._4_4_ = auVar36._4_4_;
  fStack_1f0 = auVar36._8_4_;
  fStack_1ec = auVar36._12_4_;
  local_118 = fVar35 * (float)local_1f8._0_4_ + fVar46 * auVar56._0_4_;
  fStack_114 = fVar37 * (float)local_1f8._4_4_ + fVar49 * auVar56._4_4_;
  fStack_110 = fVar38 * fStack_1f0 + fVar50 * auVar56._8_4_;
  fStack_10c = fVar39 * fStack_1ec + fVar51 * auVar56._12_4_;
  local_d8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar27._0_4_ = fVar1 * local_f8 + local_108 * fVar2 + local_118 * fVar3;
  auVar27._4_4_ = fVar1 * fStack_f4 + fStack_104 * fVar2 + fStack_114 * fVar3;
  auVar27._8_4_ = fVar1 * fStack_f0 + fStack_100 * fVar2 + fStack_110 * fVar3;
  auVar27._12_4_ = fVar1 * fStack_ec + fStack_fc * fVar2 + fStack_10c * fVar3;
  auVar33 = vcmpps_avx(auVar27,ZEXT416(0) << 0x20,4);
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  auVar27 = vblendvps_avx(auVar31,auVar27,auVar33);
  auVar31 = vunpcklps_avx(auVar29,local_e8);
  auVar28 = vunpcklps_avx(auVar34,auVar42);
  auVar56._0_4_ = fVar35 * auVar28._0_4_ + fVar46 * auVar31._0_4_;
  auVar56._4_4_ = fVar37 * auVar28._4_4_ + fVar49 * auVar31._4_4_;
  auVar56._8_4_ = fVar38 * auVar28._8_4_ + fVar50 * auVar31._8_4_;
  auVar56._12_4_ = fVar39 * auVar28._12_4_ + fVar51 * auVar31._12_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x20);
  auVar57._4_4_ = fVar4;
  auVar57._0_4_ = fVar4;
  auVar57._8_4_ = fVar4;
  auVar57._12_4_ = fVar4;
  auVar31 = vsubps_avx(auVar56,auVar57);
  fVar5 = *(float *)(ray + k * 4 + 0x10);
  auVar28._4_4_ = fVar5;
  auVar28._0_4_ = fVar5;
  auVar28._8_4_ = fVar5;
  auVar28._12_4_ = fVar5;
  auVar28 = vsubps_avx(auVar53,auVar28);
  fVar6 = *(float *)(ray + k * 4);
  auVar32._4_4_ = fVar6;
  auVar32._0_4_ = fVar6;
  auVar32._8_4_ = fVar6;
  auVar32._12_4_ = fVar6;
  auVar32 = vsubps_avx(auVar40,auVar32);
  auVar41._0_4_ = auVar32._0_4_ * local_f8 + local_108 * auVar28._0_4_ + local_118 * auVar31._0_4_;
  auVar41._4_4_ =
       auVar32._4_4_ * fStack_f4 + fStack_104 * auVar28._4_4_ + fStack_114 * auVar31._4_4_;
  auVar41._8_4_ =
       auVar32._8_4_ * fStack_f0 + fStack_100 * auVar28._8_4_ + fStack_110 * auVar31._8_4_;
  auVar41._12_4_ =
       auVar32._12_4_ * fStack_ec + fStack_fc * auVar28._12_4_ + fStack_10c * auVar31._12_4_;
  local_158 = vdivps_avx(auVar41,auVar27);
  auVar45 = ZEXT1664(local_158);
  uVar17 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar36._4_4_ = uVar17;
  auVar36._0_4_ = uVar17;
  auVar36._8_4_ = uVar17;
  auVar36._12_4_ = uVar17;
  auVar27 = vcmpps_avx(auVar36,local_158,2);
  uVar17 = *(undefined4 *)(ray + k * 4 + 0x80);
  local_1a8._4_4_ = uVar17;
  local_1a8._0_4_ = uVar17;
  local_1a8._8_4_ = uVar17;
  local_1a8._12_4_ = uVar17;
  auVar31 = vcmpps_avx(local_158,local_1a8,2);
  auVar27 = vandps_avx(auVar31,auVar27);
  auVar31 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar31 = vpcmpgtd_avx(auVar31,_DAT_01f4ad30);
  auVar27 = vandps_avx(auVar27,auVar31);
  auVar31 = auVar33 & auVar27;
  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0') {
    auVar27 = vandps_avx(auVar27,auVar33);
    auVar33 = vunpckhps_avx(auVar34,auVar42);
    auVar31 = vunpckhps_avx(auVar29,local_e8);
    fVar35 = fVar35 * auVar33._0_4_ + fVar46 * auVar31._0_4_;
    fVar37 = fVar37 * auVar33._4_4_ + fVar49 * auVar31._4_4_;
    fVar38 = fVar38 * auVar33._8_4_ + fVar50 * auVar31._8_4_;
    fVar39 = fVar39 * auVar33._12_4_ + fVar51 * auVar31._12_4_;
    fVar46 = local_158._0_4_;
    fVar49 = local_158._4_4_;
    fVar50 = local_158._8_4_;
    fVar51 = local_158._12_4_;
    auVar33._0_4_ = fVar6 + fVar1 * fVar46;
    auVar33._4_4_ = fVar6 + fVar1 * fVar49;
    auVar33._8_4_ = fVar6 + fVar1 * fVar50;
    auVar33._12_4_ = fVar6 + fVar1 * fVar51;
    auVar29._0_4_ = fVar5 + fVar2 * fVar46;
    auVar29._4_4_ = fVar5 + fVar2 * fVar49;
    auVar29._8_4_ = fVar5 + fVar2 * fVar50;
    auVar29._12_4_ = fVar5 + fVar2 * fVar51;
    auVar42._0_4_ = fVar4 + fVar46 * fVar3;
    auVar42._4_4_ = fVar4 + fVar49 * fVar3;
    auVar42._8_4_ = fVar4 + fVar50 * fVar3;
    auVar42._12_4_ = fVar4 + fVar51 * fVar3;
    auVar33 = vsubps_avx(auVar33,auVar40);
    auVar31 = vsubps_avx(auVar29,auVar53);
    auVar28 = vsubps_avx(auVar42,auVar56);
    auVar30._0_4_ =
         auVar33._0_4_ * auVar33._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar28._0_4_ * auVar28._0_4_;
    auVar30._4_4_ =
         auVar33._4_4_ * auVar33._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar28._4_4_ * auVar28._4_4_;
    auVar30._8_4_ =
         auVar33._8_4_ * auVar33._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar28._8_4_ * auVar28._8_4_;
    auVar30._12_4_ =
         auVar33._12_4_ * auVar33._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar28._12_4_ * auVar28._12_4_;
    auVar34._0_4_ = fVar35 * fVar35;
    auVar34._4_4_ = fVar37 * fVar37;
    auVar34._8_4_ = fVar38 * fVar38;
    auVar34._12_4_ = fVar39 * fVar39;
    auVar33 = vcmpps_avx(auVar30,auVar34,1);
    auVar31 = auVar27 & auVar33;
    if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0')
    {
      valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar33,auVar27);
      local_178 = ZEXT832(0) << 0x20;
      local_148 = CONCAT44(fStack_f4,local_f8);
      uStack_140 = CONCAT44(fStack_ec,fStack_f0);
      local_138 = CONCAT44(fStack_104,local_108);
      uStack_130 = CONCAT44(fStack_fc,fStack_100);
      local_128 = CONCAT44(fStack_114,local_118);
      uStack_120 = CONCAT44(fStack_10c,fStack_110);
      auVar43._8_4_ = 0x7f800000;
      auVar43._0_8_ = 0x7f8000007f800000;
      auVar43._12_4_ = 0x7f800000;
      auVar44 = ZEXT1664(auVar43);
      auVar27 = vblendvps_avx(auVar43,local_158,(undefined1  [16])valid.field_0);
      auVar33 = vshufps_avx(auVar27,auVar27,0xb1);
      auVar33 = vminps_avx(auVar33,auVar27);
      auVar31 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vminps_avx(auVar31,auVar33);
      auVar27 = vcmpps_avx(auVar27,auVar33,0);
      auVar33 = (undefined1  [16])valid.field_0 & auVar27;
      aVar13 = valid.field_0;
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) {
        aVar13 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vandps_avx(auVar27,(undefined1  [16])valid.field_0);
      }
      uVar16 = vmovmskps_avx((undefined1  [16])aVar13);
      lVar22 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      auVar47 = vcmpps_avx(ZEXT1632(auVar8),ZEXT1632(auVar8),0xf);
      auVar48 = ZEXT3264(auVar47);
      auVar52 = ZEXT864(0) << 0x20;
      auVar27 = vpcmpeqd_avx(auVar53,auVar53);
      auVar54 = ZEXT1664(auVar27);
      auVar55 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      _local_208 = auVar53;
      _local_1f8 = auVar40;
      do {
        args.hit = local_c8;
        args.valid = (int *)local_218;
        uVar16 = *(uint *)(local_d8 + lVar22 * 4);
        pRVar18 = (RTCRayN *)(ulong)uVar16;
        pGVar10 = (pSVar9->geometries).items[(long)pRVar18].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_218 + lVar22 * 4 + -0x10) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar17 = *(undefined4 *)(local_178 + lVar22 * 4);
            uVar7 = *(undefined4 *)(local_178 + lVar22 * 4 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + lVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_148 + lVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_138 + lVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_128 + lVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar17;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar22];
            *(uint *)(ray + k * 4 + 0x120) = uVar16;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_98 = *(undefined4 *)(local_178 + lVar22 * 4);
          local_88 = *(undefined4 *)(local_178 + lVar22 * 4 + 0x10);
          local_68 = vpshufd_avx(ZEXT416(uVar16),0);
          local_78 = (Disc->primIDs).field_0.i[lVar22];
          uVar17 = *(undefined4 *)((long)&local_148 + lVar22 * 4);
          uVar7 = *(undefined4 *)((long)&local_138 + lVar22 * 4);
          local_b8._4_4_ = uVar7;
          local_b8._0_4_ = uVar7;
          local_b8._8_4_ = uVar7;
          local_b8._12_4_ = uVar7;
          uVar7 = *(undefined4 *)((long)&local_128 + lVar22 * 4);
          local_a8._4_4_ = uVar7;
          local_a8._0_4_ = uVar7;
          local_a8._8_4_ = uVar7;
          local_a8._12_4_ = uVar7;
          local_c8[0] = (RTCHitN)(char)uVar17;
          local_c8[1] = (RTCHitN)(char)((uint)uVar17 >> 8);
          local_c8[2] = (RTCHitN)(char)((uint)uVar17 >> 0x10);
          local_c8[3] = (RTCHitN)(char)((uint)uVar17 >> 0x18);
          local_c8[4] = (RTCHitN)(char)uVar17;
          local_c8[5] = (RTCHitN)(char)((uint)uVar17 >> 8);
          local_c8[6] = (RTCHitN)(char)((uint)uVar17 >> 0x10);
          local_c8[7] = (RTCHitN)(char)((uint)uVar17 >> 0x18);
          local_c8[8] = (RTCHitN)(char)uVar17;
          local_c8[9] = (RTCHitN)(char)((uint)uVar17 >> 8);
          local_c8[10] = (RTCHitN)(char)((uint)uVar17 >> 0x10);
          local_c8[0xb] = (RTCHitN)(char)((uint)uVar17 >> 0x18);
          local_c8[0xc] = (RTCHitN)(char)uVar17;
          local_c8[0xd] = (RTCHitN)(char)((uint)uVar17 >> 8);
          local_c8[0xe] = (RTCHitN)(char)((uint)uVar17 >> 0x10);
          local_c8[0xf] = (RTCHitN)(char)((uint)uVar17 >> 0x18);
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_54 = context->user->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = context->user->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + lVar22 * 4);
          local_218 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          args.geometryUserPtr = pGVar10->userPtr;
          args.context = context->user;
          args.N = 4;
          pRVar18 = (RTCRayN *)pGVar10->intersectionFilterN;
          auVar27 = auVar45._0_16_;
          auVar33 = auVar55._0_16_;
          args.ray = (RTCRayN *)ray;
          if (pRVar18 != (RTCRayN *)0x0) {
            auVar47 = ZEXT1632(auVar48._0_16_);
            auVar31 = auVar54._0_16_;
            pRVar18 = (RTCRayN *)(*(code *)pRVar18)(&args);
            auVar55 = ZEXT1664(auVar33);
            auVar31 = vpcmpeqd_avx(auVar31,auVar31);
            auVar54 = ZEXT1664(auVar31);
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar47 = vcmpps_avx(auVar47,auVar47,0xf);
            auVar48 = ZEXT3264(auVar47);
            auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar45 = ZEXT1664(auVar27);
          }
          auVar31 = auVar54._0_16_;
          if (local_218 == (undefined1  [16])0x0) {
            auVar27 = vpcmpeqd_avx(auVar52._0_16_,(undefined1  [16])0x0);
            auVar31 = auVar31 ^ auVar27;
          }
          else {
            pRVar18 = (RTCRayN *)context->args->filter;
            if ((pRVar18 != (RTCRayN *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              auVar47 = ZEXT1632(auVar48._0_16_);
              pRVar18 = (RTCRayN *)(*(code *)pRVar18)(&args);
              auVar55 = ZEXT1664(auVar33);
              auVar33 = vpcmpeqd_avx(auVar31,auVar31);
              auVar54 = ZEXT1664(auVar33);
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar47 = vcmpps_avx(auVar47,auVar47,0xf);
              auVar48 = ZEXT3264(auVar47);
              auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar45 = ZEXT1664(auVar27);
            }
            auVar27 = vpcmpeqd_avx(auVar52._0_16_,local_218);
            auVar31 = auVar54._0_16_ ^ auVar27;
            if (local_218 != (undefined1  [16])0x0) {
              auVar27 = auVar54._0_16_ ^ auVar27;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])args.hit);
              *(undefined1 (*) [16])(args.ray + 0xc0) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x10));
              *(undefined1 (*) [16])(args.ray + 0xd0) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x20));
              *(undefined1 (*) [16])(args.ray + 0xe0) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x30));
              *(undefined1 (*) [16])(args.ray + 0xf0) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x40));
              *(undefined1 (*) [16])(args.ray + 0x100) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x50));
              *(undefined1 (*) [16])(args.ray + 0x110) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x60));
              *(undefined1 (*) [16])(args.ray + 0x120) = auVar33;
              auVar33 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x70));
              *(undefined1 (*) [16])(args.ray + 0x130) = auVar33;
              auVar27 = vmaskmovps_avx(auVar27,*(undefined1 (*) [16])(args.hit + 0x80));
              *(undefined1 (*) [16])(args.ray + 0x140) = auVar27;
              pRVar18 = args.ray;
            }
          }
          if ((auVar55._0_16_ & auVar31) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = local_1a8._0_4_;
          }
          else {
            local_1a8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_218 + lVar22 * 4 + -0x10) = 0;
          auVar27 = vshufps_avx(local_1a8,local_1a8,0);
          auVar27 = vcmpps_avx(auVar45._0_16_,auVar27,2);
          valid.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
               vandps_avx(auVar27,(undefined1  [16])valid.field_0);
        }
        if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0 &&
             ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
             (undefined1  [16])0x0) &&
            ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) {
          return;
        }
        auVar27 = vblendvps_avx(auVar44._0_16_,auVar45._0_16_,(undefined1  [16])valid.field_0);
        auVar33 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar33 = vminps_avx(auVar33,auVar27);
        auVar31 = vshufpd_avx(auVar33,auVar33,1);
        auVar33 = vminps_avx(auVar31,auVar33);
        auVar27 = vcmpps_avx(auVar27,auVar33,0);
        auVar33 = (undefined1  [16])valid.field_0 & auVar27;
        aVar13 = valid.field_0;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          aVar13.v = (__m128)vandps_avx(auVar27,valid.field_0);
        }
        uVar17 = vmovmskps_avx((undefined1  [16])aVar13);
        uVar19 = CONCAT44((int)((ulong)pRVar18 >> 0x20),uVar17);
        lVar22 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }